

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void AssignFuncSymRegister
               (ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,FuncInfo *callee)

{
  undefined1 *puVar1;
  Symbol *sym;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  ParseNodeVar *pPVar6;
  FuncInfo *pFVar7;
  Symbol *this;
  Scope *pSVar8;
  
  pPVar6 = pnodeFnc->pnodeName;
  if (pPVar6 != (ParseNodeVar *)0x0) {
    if ((pPVar6->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xa40,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar3) goto LAB_00827fc1;
      *puVar5 = 0;
      pPVar6 = pnodeFnc->pnodeName;
    }
    sym = pPVar6->sym;
    if (sym != (Symbol *)0x0) {
      if (((sym->field_0x42 & 8) == 0) &&
         ((callee->funcExprScope == (Scope *)0x0 || ((callee->funcExprScope->field_0x44 & 2) == 0)))
         ) {
        if ((pnodeFnc->fncFlags & kFunctionDeclaration) != kFunctionNone) {
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,sym);
          (pnodeFnc->super_ParseNode).location = sym->location;
          if (byteCodeGenerator->currentScope->func != sym->scope->func) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xa61,
                               "(byteCodeGenerator->GetCurrentScope()->GetFunc() == sym->GetScope()->GetFunc())"
                               ,
                               "byteCodeGenerator->GetCurrentScope()->GetFunc() == sym->GetScope()->GetFunc()"
                              );
            if (!bVar3) {
LAB_00827fc1:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar5 = 0;
            pFVar7 = byteCodeGenerator->currentScope->func;
            if (pFVar7 != sym->scope->func) {
              pFVar7 = ByteCodeGenerator::GetParentFuncInfo(pFVar7);
              pSVar8 = sym->scope;
              if (pFVar7 != pSVar8->func) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar5 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xa64,
                                   "(ByteCodeGenerator::GetParentFuncInfo(byteCodeGenerator->GetCurrentScope()->GetFunc()) == sym->GetScope()->GetFunc())"
                                   ,
                                   "ByteCodeGenerator::GetParentFuncInfo(byteCodeGenerator->GetCurrentScope()->GetFunc()) == sym->GetScope()->GetFunc()"
                                  );
                if (!bVar3) goto LAB_00827fc1;
                *puVar5 = 0;
                pSVar8 = sym->scope;
              }
              pSVar8->field_0x44 = pSVar8->field_0x44 | 0x10;
              ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,sym);
              puVar1 = &sym->scope->func->field_0xb4;
              *(uint *)puVar1 = *(uint *)puVar1 | 0x40;
            }
          }
          this = Symbol::GetFuncScopeVarSym(sym);
          if (this == (Symbol *)0x0) {
            return;
          }
          if ((this->field_0x42 & 8) != 0) {
            return;
          }
          bVar3 = Symbol::IsInSlot(this,byteCodeGenerator,sym->scope->func,false);
          if (bVar3) {
            return;
          }
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,this);
          return;
        }
        if ((callee->field_0xb5 & 2) == 0) {
          return;
        }
      }
      else if ((pnodeFnc->fncFlags & kFunctionDeclaration) != kFunctionNone) {
        return;
      }
      if (sym->location == 0xffffffff) {
        RVar4 = FuncInfo::NextVarRegister(callee);
        sym->location = RVar4;
      }
    }
  }
  return;
}

Assistant:

void AssignFuncSymRegister(ParseNodeFnc * pnodeFnc, ByteCodeGenerator * byteCodeGenerator, FuncInfo * callee)
{
    // register to hold the allocated function (in enclosing sequence of global statements)
    // TODO: Make the parser identify uses of function decls as RHS's of expressions.
    // Currently they're all marked as used, so they all get permanent (non-temp) registers.
    if (pnodeFnc->pnodeName == nullptr)
    {
        return;
    }
    Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
    Symbol *sym = pnodeFnc->pnodeName->sym;
    if (sym)
    {
        if (!sym->GetIsGlobal() && !(callee->funcExprScope && callee->funcExprScope->GetIsObject()))
        {
            // If the func decl is used, we have to give the expression a register to protect against:
            // x.x = function f() {...};
            // x.y = function f() {...};
            // If we let the value reside in the local slot for f, then both assignments will get the
            // second definition.
            if (!pnodeFnc->IsDeclaration())
            {
                // A named function expression's name belongs to the enclosing scope.
                // In ES5 mode, it is visible only inside the inner function.
                // Allocate a register for the 'name' symbol from an appropriate register namespace.
                if (callee->GetFuncExprNameReference())
                {
                    // This is a function expression with a name, but probably doesn't have a use within
                    // the function. If that is the case then allocate a register for LdFuncExpr inside the function
                    // we just finished post-visiting.
                    if (sym->GetLocation() == Js::Constants::NoRegister)
                    {
                        sym->SetLocation(callee->NextVarRegister());
                    }
                }
            }
            else
            {
                // Function declaration
                byteCodeGenerator->AssignRegister(sym);
                pnodeFnc->location = sym->GetLocation();

                Assert(byteCodeGenerator->GetCurrentScope()->GetFunc() == sym->GetScope()->GetFunc());
                if (byteCodeGenerator->GetCurrentScope()->GetFunc() != sym->GetScope()->GetFunc())
                {
                    Assert(ByteCodeGenerator::GetParentFuncInfo(byteCodeGenerator->GetCurrentScope()->GetFunc()) == sym->GetScope()->GetFunc());
                    sym->GetScope()->SetMustInstantiate(true);
                    byteCodeGenerator->ProcessCapturedSym(sym);
                    sym->GetScope()->GetFunc()->SetHasLocalInClosure(true);
                }

                Symbol * functionScopeVarSym = sym->GetFuncScopeVarSym();
                if (functionScopeVarSym &&
                    !functionScopeVarSym->GetIsGlobal() &&
                    !functionScopeVarSym->IsInSlot(byteCodeGenerator, sym->GetScope()->GetFunc()))
                {
                    byteCodeGenerator->AssignRegister(functionScopeVarSym);
                }
            }
        }
        else if (!pnodeFnc->IsDeclaration())
        {
            if (sym->GetLocation() == Js::Constants::NoRegister)
            {
                // Here, we are assigning a register for the LdFuncExpr instruction inside the function we just finished
                // post-visiting. The symbol is given a register from the register pool for the function we just finished
                // post-visiting, rather than from the parent function's register pool.
                sym->SetLocation(callee->NextVarRegister());
            }
        }
    }
}